

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O1

bool duckdb::ExtractFunctionData<duckdb::ScalarFunctionCatalogEntry,duckdb::ScalarFunctionExtractor>
               (FunctionEntry *entry,idx_t function_idx,DataChunk *output,idx_t output_offset)

{
  pointer pcVar1;
  SchemaCatalogEntry *pSVar2;
  size_t __n;
  pointer pSVar3;
  pointer pSVar4;
  bool bVar5;
  bool bVar6;
  ScalarFunctionCatalogEntry *entry_00;
  idx_t offset;
  size_type sVar7;
  char cVar8;
  int iVar9;
  idx_t iVar10;
  reference pvVar11;
  string *psVar12;
  long lVar13;
  vector<duckdb::Value,_true> *pvVar14;
  reference __args;
  long *plVar15;
  ulong uVar16;
  size_type *psVar17;
  ulong __val;
  char cVar18;
  DataChunk *pDVar19;
  string __str;
  ScalarFunctionCatalogEntry *function;
  optional_idx description_idx;
  vector<duckdb::LogicalType,_true> parameter_types_vector;
  Value parameter_types_value;
  Value VStack_2c8;
  DataChunk *local_288;
  idx_t local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [32];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_238;
  ScalarFunctionCatalogEntry *local_220;
  idx_t local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  undefined1 local_208 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  vStack_1f0;
  _Alloc_hider local_1d8;
  size_type sStack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  pointer local_1b8;
  pointer pbStack_1b0;
  pointer local_1a8;
  pointer pbStack_1a0;
  pointer local_198;
  pointer pbStack_190;
  vector<duckdb::Value,_true> local_188;
  vector<duckdb::Value,_true> local_170;
  LogicalType local_158;
  LogicalType local_140;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  Value local_70;
  
  ScalarFunctionExtractor::GetParameterLogicalTypes
            ((vector<duckdb::LogicalType,_true> *)&local_128,(ScalarFunctionCatalogEntry *)entry,
             function_idx);
  ScalarFunctionExtractor::GetParameterTypes
            (&local_70,(ScalarFunctionCatalogEntry *)entry,function_idx);
  local_210._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       GetFunctionDescriptionIndex
                 (&entry->descriptions,(vector<duckdb::LogicalType,_true> *)&local_128);
  if (local_210._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
    local_1c8._8_8_ = 0;
    local_198 = (pointer)0x0;
    pbStack_190 = (pointer)0x0;
    local_1a8 = (pointer)0x0;
    pbStack_1a0 = (pointer)0x0;
    vStack_1f0.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_1f0.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208._16_8_ = (pointer)0x0;
    vStack_1f0.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208._0_8_ = (pointer)0x0;
    local_208._8_8_ = (pointer)0x0;
    local_1b8 = (pointer)0x0;
    pbStack_1b0 = (pointer)0x0;
    sStack_1d0 = 0;
    local_1c8._M_allocated_capacity = 0;
    local_1d8._M_p = (pointer)&local_1c8;
  }
  else {
    iVar10 = optional_idx::GetIndex((optional_idx *)&local_210);
    pvVar11 = vector<duckdb::FunctionDescription,_true>::operator[](&entry->descriptions,iVar10);
    FunctionDescription::FunctionDescription((FunctionDescription *)local_208,pvVar11);
  }
  psVar12 = Catalog::GetName_abi_cxx11_
                      ((((entry->super_StandardEntry).schema)->super_InCatalogEntry).catalog);
  pcVar1 = (psVar12->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + psVar12->_M_string_length);
  Value::Value(&VStack_2c8,&local_90);
  DataChunk::SetValue(output,0,output_offset,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  iVar10 = Catalog::GetOid((((entry->super_StandardEntry).schema)->super_InCatalogEntry).catalog);
  lVar13 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar10);
  Value::BIGINT(&VStack_2c8,lVar13);
  DataChunk::SetValue(output,1,output_offset,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  pSVar2 = (entry->super_StandardEntry).schema;
  pcVar1 = (pSVar2->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,
             pcVar1 + (pSVar2->super_InCatalogEntry).super_CatalogEntry.name._M_string_length);
  Value::Value(&VStack_2c8,&local_b0);
  DataChunk::SetValue(output,2,output_offset,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  pcVar1 = (entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name._M_dataplus.
           _M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,
             pcVar1 + (entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                      _M_string_length);
  Value::Value(&VStack_2c8,&local_d0);
  DataChunk::SetValue(output,3,output_offset,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  __n = (entry->alias_of)._M_string_length;
  local_288 = output;
  local_280 = output_offset;
  if (__n == 0) {
LAB_01538374:
    LogicalType::LogicalType(&local_140,SQLNULL);
    bVar6 = true;
    Value::Value(&VStack_2c8,&local_140);
    bVar5 = false;
  }
  else {
    if (__n == (entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
               _M_string_length) {
      iVar9 = bcmp((entry->alias_of)._M_dataplus._M_p,
                   (entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                   _M_dataplus._M_p,__n);
      if (iVar9 == 0) goto LAB_01538374;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    pcVar1 = (entry->alias_of)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_f0,pcVar1,pcVar1 + __n);
    Value::Value(&VStack_2c8,&local_f0);
    bVar5 = true;
    bVar6 = false;
  }
  DataChunk::SetValue(local_288,4,local_280,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (bVar6) {
    LogicalType::~LogicalType(&local_140);
  }
  Value::Value(&VStack_2c8,"scalar");
  DataChunk::SetValue(local_288,5,local_280,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  sVar7 = sStack_1d0;
  if (sStack_1d0 == 0) {
    LogicalType::LogicalType(&local_158,SQLNULL);
    Value::Value(&VStack_2c8,&local_158);
  }
  else {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,local_1d8._M_p,local_1d8._M_p + sStack_1d0);
    Value::Value(&VStack_2c8,&local_110);
  }
  DataChunk::SetValue(local_288,6,local_280,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  iVar10 = local_280;
  pDVar19 = local_288;
  if (sVar7 == 0) {
    LogicalType::~LogicalType(&local_158);
    iVar10 = local_280;
    pDVar19 = local_288;
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  DataChunk::SetValue(pDVar19,7,iVar10,
                      &(entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment)
  ;
  Value::MAP(&VStack_2c8,&(entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.tags)
  ;
  DataChunk::SetValue(pDVar19,8,iVar10,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  ScalarFunctionExtractor::GetReturnType
            (&VStack_2c8,(ScalarFunctionCatalogEntry *)entry,function_idx);
  DataChunk::SetValue(pDVar19,9,iVar10,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_220 = (ScalarFunctionCatalogEntry *)entry;
  local_218 = function_idx;
  if (vStack_1f0.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      vStack_1f0.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ScalarFunctionExtractor::GetParameters
              ((vector<duckdb::Value,_true> *)local_258,(ScalarFunctionCatalogEntry *)entry,
               function_idx);
    local_278.field_2._M_allocated_capacity =
         (size_type)
         local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_278._M_string_length =
         (size_type)
         local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_278._M_dataplus._M_p =
         (pointer)local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_258._0_8_;
    local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_258._8_8_;
    local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_258._16_8_;
    local_258._0_8_ = (pointer)0x0;
    local_258._8_8_ = (pointer)0x0;
    local_258._16_8_ = (pointer)0x0;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_278);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_258);
  }
  else {
    __val = 0;
    while( true ) {
      pvVar14 = ListValue::GetChildren(&local_70);
      if ((ulong)((long)(pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start >> 6) <= __val) break;
      if (__val < (ulong)((long)vStack_1f0.
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)vStack_1f0.
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        __args = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[](&vStack_1f0,__val);
        ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_238,__args);
      }
      else {
        cVar18 = '\x01';
        if (9 < __val) {
          uVar16 = __val;
          cVar8 = '\x04';
          do {
            cVar18 = cVar8;
            if (uVar16 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_0153864d;
            }
            if (uVar16 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_0153864d;
            }
            if (uVar16 < 10000) goto LAB_0153864d;
            bVar5 = 99999 < uVar16;
            uVar16 = uVar16 / 10000;
            cVar8 = cVar18 + '\x04';
          } while (bVar5);
          cVar18 = cVar18 + '\x01';
        }
LAB_0153864d:
        local_258._0_8_ = local_258 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_258,cVar18);
        ::std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_258._0_8_,local_258._8_4_,__val);
        plVar15 = (long *)::std::__cxx11::string::replace((ulong)local_258,0,(char *)0x0,0x1e2101e);
        psVar17 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_278.field_2._M_allocated_capacity = *psVar17;
          local_278.field_2._8_8_ = plVar15[3];
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        }
        else {
          local_278.field_2._M_allocated_capacity = *psVar17;
          local_278._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_278._M_string_length = plVar15[1];
        *plVar15 = (long)psVar17;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
        emplace_back<std::__cxx11::string>
                  ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_238,&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
        if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_);
        }
      }
      __val = __val + 1;
    }
  }
  LogicalType::LogicalType((LogicalType *)&local_278,VARCHAR);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_258,&local_238);
  iVar10 = local_280;
  pDVar19 = local_288;
  Value::LIST(&VStack_2c8,(LogicalType *)&local_278,(vector<duckdb::Value,_true> *)local_258);
  offset = local_218;
  entry_00 = local_220;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_258);
  LogicalType::~LogicalType((LogicalType *)&local_278);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_238);
  DataChunk::SetValue(pDVar19,10,iVar10,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  DataChunk::SetValue(pDVar19,0xb,iVar10,&local_70);
  ScalarFunctionExtractor::GetVarArgs(&VStack_2c8,entry_00,offset);
  DataChunk::SetValue(pDVar19,0xc,iVar10,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  ScalarFunctionExtractor::GetMacroDefinition(&VStack_2c8,entry_00,offset);
  DataChunk::SetValue(pDVar19,0xd,iVar10,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  ScalarFunctionExtractor::IsVolatile(&VStack_2c8,entry_00,offset);
  DataChunk::SetValue(pDVar19,0xe,iVar10,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  Value::BOOLEAN(&VStack_2c8,
                 (entry_00->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                 super_CatalogEntry.internal);
  DataChunk::SetValue(pDVar19,0xf,iVar10,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  lVar13 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                     ((entry_00->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                      super_CatalogEntry.oid);
  Value::BIGINT(&VStack_2c8,lVar13);
  DataChunk::SetValue(pDVar19,0x10,iVar10,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  LogicalType::LogicalType((LogicalType *)&local_278,VARCHAR);
  ToValueVector(&local_170,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)&local_1b8);
  Value::LIST(&VStack_2c8,(LogicalType *)&local_278,&local_170);
  DataChunk::SetValue(pDVar19,0x11,iVar10,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_170);
  LogicalType::~LogicalType((LogicalType *)&local_278);
  ScalarFunctionExtractor::ResultType(&VStack_2c8,entry_00,offset);
  DataChunk::SetValue(pDVar19,0x12,iVar10,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  LogicalType::LogicalType((LogicalType *)&local_278,VARCHAR);
  ToValueVector(&local_188,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)&pbStack_1a0);
  Value::LIST(&VStack_2c8,(LogicalType *)&local_278,&local_188);
  DataChunk::SetValue(pDVar19,0x13,iVar10,&VStack_2c8);
  Value::~Value(&VStack_2c8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_188);
  LogicalType::~LogicalType((LogicalType *)&local_278);
  pSVar3 = (entry_00->functions).super_FunctionSet<duckdb::ScalarFunction>.functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar4 = *(pointer *)
            ((long)&(entry_00->functions).super_FunctionSet<duckdb::ScalarFunction>.functions.
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                    super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                    ._M_impl + 8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&pbStack_1a0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_p != &local_1c8) {
    operator_delete(local_1d8._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&vStack_1f0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_208);
  Value::~Value(&local_70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_128);
  return offset + 1 == ((long)pSVar4 - (long)pSVar3 >> 3) * 0x14c1bacf914c1bad;
}

Assistant:

bool ExtractFunctionData(FunctionEntry &entry, idx_t function_idx, DataChunk &output, idx_t output_offset) {
	auto &function = entry.Cast<T>();
	vector<LogicalType> parameter_types_vector = OP::GetParameterLogicalTypes(function, function_idx);
	Value parameter_types_value = OP::GetParameterTypes(function, function_idx);
	optional_idx description_idx = GetFunctionDescriptionIndex(entry.descriptions, parameter_types_vector);
	FunctionDescription function_description =
	    description_idx.IsValid() ? entry.descriptions[description_idx.GetIndex()] : FunctionDescription();

	idx_t col = 0;

	// database_name, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(function.schema.catalog.GetName()));

	// database_oid, BIGINT
	output.SetValue(col++, output_offset, Value::BIGINT(NumericCast<int64_t>(function.schema.catalog.GetOid())));

	// schema_name, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(function.schema.name));

	// function_name, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(function.name));

	// alias_of, LogicalType::VARCHAR
	output.SetValue(col++, output_offset,
	                function.alias_of.empty() || function.alias_of == function.name ? Value()
	                                                                                : Value(function.alias_of));

	// function_type, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(OP::GetFunctionType()));

	// function_description, LogicalType::VARCHAR
	output.SetValue(col++, output_offset,
	                (function_description.description.empty()) ? Value() : Value(function_description.description));

	// comment, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, entry.comment);

	// tags, LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR)
	output.SetValue(col++, output_offset, Value::MAP(entry.tags));

	// return_type, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::GetReturnType(function, function_idx));

	// parameters, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset,
	                GetParameterNames<T, OP>(function, function_idx, function_description, parameter_types_value));

	// parameter_types, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset, parameter_types_value);

	// varargs, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::GetVarArgs(function, function_idx));

	// macro_definition, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::GetMacroDefinition(function, function_idx));

	// has_side_effects, LogicalType::BOOLEAN
	output.SetValue(col++, output_offset, OP::IsVolatile(function, function_idx));

	// internal, LogicalType::BOOLEAN
	output.SetValue(col++, output_offset, Value::BOOLEAN(function.internal));

	// function_oid, LogicalType::BIGINT
	output.SetValue(col++, output_offset, Value::BIGINT(NumericCast<int64_t>(function.oid)));

	// examples, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset,
	                Value::LIST(LogicalType::VARCHAR, ToValueVector(function_description.examples)));

	// stability, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::ResultType(function, function_idx));

	// categories, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset,
	                Value::LIST(LogicalType::VARCHAR, ToValueVector(function_description.categories)));

	return function_idx + 1 == OP::FunctionCount(function);
}